

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

termchar * term_bidi_line(Terminal *term,termline *ldata,wchar_t scr_y)

{
  wchar_t wVar1;
  short *psVar2;
  truecolour *ptVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  bidi_cache_entry *pbVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  _Bool _Var11;
  wchar_t wVar12;
  bidi_char *pbVar13;
  termchar *ptVar14;
  bidi_cache_entry *pbVar15;
  termchar *ptVar16;
  wchar_t *pwVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  termchar **pptVar25;
  ulong uVar26;
  ulong uVar27;
  termchar *ptVar28;
  ulong uVar29;
  uint uVar30;
  undefined4 uVar31;
  unicode_data *puVar32;
  long lVar33;
  unsigned_long *puVar34;
  size_t __n;
  wchar_t wVar35;
  int iVar36;
  ulong oldlen;
  bool bVar37;
  
  if (((term->no_bidi == true) && (term->no_arabicshaping == true)) &&
     ((ldata->trusted != true || (term->cols < L'\x04')))) {
    ptVar14 = (termchar *)0x0;
  }
  else {
    wVar35 = term->cols;
    pbVar15 = term->pre_bidi_cache;
    oldlen = (ulong)scr_y;
    if ((pbVar15 != (bidi_cache_entry *)0x0) && (oldlen < term->bidi_cache_size)) {
      if ((pbVar15[oldlen].chars != (termchar *)0x0) &&
         ((pbVar15[oldlen].width == wVar35 && (pbVar15[oldlen].trusted == ldata->trusted)))) {
        uVar18 = 0;
        if (L'\0' < wVar35) {
          uVar18 = (ulong)(uint)wVar35;
        }
        lVar24 = uVar18 + 1;
        ptVar14 = ldata->chars;
        ptVar28 = pbVar15[oldlen].chars;
        do {
          lVar24 = lVar24 + -1;
          if (lVar24 == 0) {
            pptVar25 = &term->post_bidi_cache[oldlen].chars;
            goto LAB_0010bb42;
          }
          _Var11 = termchars_equal(ptVar28,ptVar14);
          ptVar14 = ptVar14 + 1;
          ptVar28 = ptVar28 + 1;
        } while (_Var11);
      }
    }
    if (term->wcFromTo_size < wVar35) {
      term->wcFromTo_size = wVar35;
      pbVar13 = (bidi_char *)saferealloc(term->wcFrom,(long)wVar35,0xc);
      term->wcFrom = pbVar13;
      pbVar13 = (bidi_char *)saferealloc(term->wcTo,(long)term->wcFromTo_size,0xc);
      term->wcTo = pbVar13;
      wVar35 = term->cols;
    }
    lVar24 = 0;
    uVar18 = 0;
    if (L'\0' < wVar35) {
      uVar18 = (ulong)(uint)wVar35;
    }
    lVar21 = 10;
    for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
      uVar20 = *(ulong *)((long)&ldata->chars->chr + lVar24);
      uVar30 = (uint)uVar20 & 0xffffff00;
      if (uVar30 == 0xda00) {
        pwVar17 = term->ucsdata->unitab_scoacs;
LAB_0010b598:
        uVar20 = (ulong)(uint)pwVar17[uVar20 & 0xff];
      }
      else {
        if (uVar30 == 0xd900) {
          puVar32 = term->ucsdata;
          if (term->rawcnp != false) goto LAB_0010b57b;
          pwVar17 = puVar32->unitab_xterm;
          goto LAB_0010b598;
        }
        if (uVar30 == 0xd800) {
          puVar32 = term->ucsdata;
LAB_0010b57b:
          pwVar17 = puVar32->unitab_line;
          goto LAB_0010b598;
        }
      }
      uVar30 = (uint)uVar20;
      if ((uVar30 & 0xffffff00) == 0xdd00) {
        lVar33 = 0x80c;
LAB_0010b5ca:
        uVar30 = *(uint *)((long)term->ucsdata->unitab_scoacs + (uVar20 & 0xff) * 4 + lVar33 + -0xc)
        ;
      }
      else if ((uVar30 & 0xffffff00) == 0xdc00) {
        lVar33 = 0x100c;
        goto LAB_0010b5ca;
      }
      pbVar13 = term->wcFrom;
      *(uint *)((long)pbVar13 + lVar21 + -6) = uVar30;
      *(uint *)((long)pbVar13 + lVar21 + -10) = uVar30;
      *(short *)((long)pbVar13 + lVar21 + -2) = (short)uVar26;
      *(undefined2 *)((long)&pbVar13->origwc + lVar21) = 1;
      lVar21 = lVar21 + 0xc;
      lVar24 = lVar24 + 0x20;
    }
    if ((L'\x03' < wVar35) && (ldata->trusted != false)) {
      memmove(term->wcFrom + 3,term->wcFrom,(ulong)(uint)(wVar35 + L'\xfffffffd') * 0xc);
      pbVar13 = term->wcFrom;
      for (lVar24 = 0; lVar24 != 0x24; lVar24 = lVar24 + 0xc) {
        uVar31 = 0x20;
        if (lVar24 == 0xc) {
          uVar31 = 0xdfff;
        }
        if (lVar24 == 0) {
          uVar31 = 0xdffe;
        }
        *(undefined4 *)((long)&pbVar13->wc + lVar24) = uVar31;
        *(undefined4 *)((long)&pbVar13->origwc + lVar24) = uVar31;
        *(undefined4 *)((long)&pbVar13->index + lVar24) = 0x1ffff;
      }
      wVar35 = term->cols;
    }
    __n = 0;
    sVar22 = 0;
    wVar12 = L'\0';
    while (wVar12 < wVar35) {
      pbVar13 = term->wcFrom;
      *(undefined4 *)((long)&pbVar13->index + __n) = *(undefined4 *)&pbVar13[wVar12].index;
      *(undefined8 *)((long)&pbVar13->origwc + __n) = *(undefined8 *)(pbVar13 + wVar12);
      wVar1 = wVar12 + L'\x01';
      wVar35 = term->cols;
      if ((wVar1 < wVar35) && (term->wcFrom[wVar1].wc == 0xdfff)) {
        psVar2 = (short *)((long)&term->wcFrom->nchars + __n);
        *psVar2 = *psVar2 + 1;
        wVar1 = wVar12 + L'\x02';
      }
      wVar12 = wVar1;
      sVar22 = sVar22 + 1;
      __n = __n + 0xc;
    }
    if (term->no_bidi == false) {
      do_bidi(term->bidi_ctx,term->wcFrom,sVar22);
    }
    if (term->no_arabicshaping == false) {
      do_shape(term->wcFrom,term->wcTo,(wchar_t)sVar22);
    }
    else {
      memcpy(term->wcTo,term->wcFrom,__n);
    }
    wVar35 = ldata->size;
    if (term->ltemp_size < wVar35) {
      term->ltemp_size = wVar35;
      ptVar14 = (termchar *)saferealloc(term->ltemp,(long)wVar35,0x20);
      term->ltemp = ptVar14;
      wVar35 = ldata->size;
    }
    else {
      ptVar14 = term->ltemp;
    }
    pptVar25 = &term->ltemp;
    memcpy(ptVar14,ldata->chars,(long)wVar35 << 5);
    wVar35 = L'\0';
    for (sVar19 = 0; uVar18 = (ulong)wVar35, sVar22 != sVar19; sVar19 = sVar19 + 1) {
      pbVar13 = term->wcTo;
      uVar4 = pbVar13[sVar19].index;
      iVar36 = -wVar35;
      lVar24 = uVar18 << 5;
      for (uVar30 = 0; uVar30 < pbVar13[sVar19].nchars; uVar30 = uVar30 + 1) {
        puVar34 = (unsigned_long *)((long)&(*pptVar25)->chr + lVar24);
        if (uVar4 == 0xffff) {
          uVar8 = (term->basic_erase_char).chr;
          uVar9 = (term->basic_erase_char).attr;
          uVar10 = *(unsigned_long *)&(term->basic_erase_char).cc_next;
          *(truecolour *)(puVar34 + 2) = (term->basic_erase_char).truecolour;
          puVar34[3] = uVar10;
          *puVar34 = uVar8;
          puVar34[1] = uVar9;
          uVar18 = 0xdfff;
          if (uVar30 == 0) {
            uVar18 = (ulong)term->wcTo[sVar19].origwc;
          }
          ptVar14 = *pptVar25;
LAB_0010b85d:
          *(ulong *)((long)&ptVar14->chr + lVar24) = uVar18;
        }
        else {
          ptVar14 = ldata->chars + uVar4;
          uVar8 = ptVar14->chr;
          uVar9 = ptVar14->attr;
          ptVar3 = &ldata->chars[uVar4].truecolour;
          uVar10 = *(unsigned_long *)(ptVar3 + 1);
          *(truecolour *)(puVar34 + 2) = *ptVar3;
          puVar34[3] = uVar10;
          *puVar34 = uVar8;
          puVar34[1] = uVar9;
          ptVar14 = *pptVar25;
          iVar5 = *(int *)((long)&ptVar14->cc_next + lVar24);
          if (iVar5 != 0) {
            *(uint *)((long)&ptVar14->cc_next + lVar24) = iVar5 + (uint)uVar4 + iVar36;
          }
          uVar18 = 0xdfff;
          if ((uVar30 != 0) ||
             (uVar6 = term->wcTo[sVar19].wc, uVar18 = (ulong)uVar6,
             term->wcTo[sVar19].origwc != uVar6)) goto LAB_0010b85d;
        }
        pbVar13 = term->wcTo;
        iVar36 = iVar36 + -1;
        lVar24 = lVar24 + 0x20;
      }
      wVar35 = -iVar36;
    }
    if (wVar35 != term->cols) {
      __assert_fail("opos == term->cols",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x16e9,"termchar *term_bidi_line(Terminal *, struct termline *, int)");
    }
    ptVar14 = ldata->chars;
    ptVar28 = term->ltemp;
    pbVar13 = term->wcTo;
    sVar22 = (size_t)ldata->size;
    _Var11 = ldata->trusted;
    pbVar15 = term->pre_bidi_cache;
    uVar26 = term->bidi_cache_size;
    if (pbVar15 == (bidi_cache_entry *)0x0 || uVar26 <= oldlen) {
      pbVar15 = (bidi_cache_entry *)
                safegrowarray(pbVar15,&term->bidi_cache_size,0x20,oldlen,1,false);
      term->pre_bidi_cache = pbVar15;
      pbVar15 = (bidi_cache_entry *)saferealloc(term->post_bidi_cache,term->bidi_cache_size,0x20);
      term->post_bidi_cache = pbVar15;
      uVar20 = term->bidi_cache_size;
      lVar24 = uVar26 << 5;
      for (; uVar26 < uVar20; uVar26 = uVar26 + 1) {
        *(undefined8 *)((long)&pbVar15->chars + lVar24) = 0;
        pbVar7 = term->pre_bidi_cache;
        *(undefined8 *)((long)&pbVar7->chars + lVar24) = 0;
        *(undefined4 *)((long)&pbVar15->width + lVar24) = 0xffffffff;
        *(undefined4 *)((long)&pbVar7->width + lVar24) = 0xffffffff;
        (&pbVar7->trusted)[lVar24] = false;
        (&pbVar15->trusted)[lVar24] = false;
        *(undefined8 *)((long)&pbVar15->forward + lVar24) = 0;
        *(undefined8 *)((long)&pbVar7->forward + lVar24) = 0;
        *(undefined8 *)((long)&pbVar15->backward + lVar24) = 0;
        *(undefined8 *)((long)&pbVar7->backward + lVar24) = 0;
        lVar24 = lVar24 + 0x20;
      }
      pbVar15 = term->pre_bidi_cache;
    }
    safefree(pbVar15[oldlen].chars);
    safefree(term->post_bidi_cache[oldlen].chars);
    safefree(term->post_bidi_cache[oldlen].forward);
    safefree(term->post_bidi_cache[oldlen].backward);
    pbVar15 = term->pre_bidi_cache;
    pbVar15[oldlen].width = wVar35;
    pbVar15[oldlen].trusted = _Var11;
    ptVar16 = (termchar *)safemalloc(sVar22,0x20,0);
    term->pre_bidi_cache[oldlen].chars = ptVar16;
    pbVar15 = term->post_bidi_cache;
    pbVar15[oldlen].width = wVar35;
    pbVar15[oldlen].trusted = _Var11;
    ptVar16 = (termchar *)safemalloc(sVar22,0x20,0);
    term->post_bidi_cache[oldlen].chars = ptVar16;
    pwVar17 = (wchar_t *)safemalloc(uVar18,4,0);
    term->post_bidi_cache[oldlen].forward = pwVar17;
    pwVar17 = (wchar_t *)safemalloc(uVar18,4,0);
    term->post_bidi_cache[oldlen].backward = pwVar17;
    memcpy(term->pre_bidi_cache[oldlen].chars,ptVar14,sVar22 << 5);
    memcpy(term->post_bidi_cache[oldlen].chars,ptVar28,sVar22 << 5);
    memset(term->post_bidi_cache[oldlen].forward,0,uVar18 * 4);
    memset(term->post_bidi_cache[oldlen].backward,0,uVar18 * 4);
    lVar24 = 0;
    for (uVar26 = 0; uVar26 < uVar18; uVar26 = uVar26 + uVar20) {
      uVar4 = pbVar13[lVar24].index;
      if (uVar4 == 0xffff) {
        uVar20 = (ulong)pbVar13[lVar24].nchars;
      }
      else {
        if (wVar35 <= (int)(uint)uVar4) {
          __assert_fail("0 <= p && p < width",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x1663,
                        "void term_bidi_cache_store(Terminal *, int, termchar *, termchar *, bidi_char *, int, int, _Bool)"
                       );
        }
        uVar20 = (ulong)pbVar13[lVar24].nchars;
        uVar23 = (ulong)(uint)uVar4;
        uVar27 = uVar20;
        uVar29 = uVar26;
        while (bVar37 = uVar27 != 0, uVar27 = uVar27 - 1, bVar37) {
          pbVar15 = term->post_bidi_cache;
          pbVar15[oldlen].backward[uVar29] = (wchar_t)uVar23;
          pbVar15[oldlen].forward[uVar23] = (wchar_t)uVar29;
          uVar29 = uVar29 + 1;
          uVar23 = uVar23 + 1;
        }
      }
      lVar24 = lVar24 + 1;
    }
LAB_0010bb42:
    ptVar14 = *pptVar25;
  }
  return ptVar14;
}

Assistant:

static termchar *term_bidi_line(Terminal *term, struct termline *ldata,
                                int scr_y)
{
    termchar *lchars;
    int it;

    /* Do Arabic shaping and bidi. */
    if (!term->no_bidi || !term->no_arabicshaping ||
        (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH)) {

        if (!term_bidi_cache_hit(term, scr_y, ldata->chars, term->cols,
                                 ldata->trusted)) {

            if (term->wcFromTo_size < term->cols) {
                term->wcFromTo_size = term->cols;
                term->wcFrom = sresize(term->wcFrom, term->wcFromTo_size,
                                       bidi_char);
                term->wcTo = sresize(term->wcTo, term->wcFromTo_size,
                                     bidi_char);
            }

            for(it=0; it<term->cols ; it++)
            {
                unsigned long uc = (ldata->chars[it].chr);

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                term->wcFrom[it].origwc = term->wcFrom[it].wc =
                    (unsigned int)uc;
                term->wcFrom[it].index = it;
                term->wcFrom[it].nchars = 1;
            }

            if (ldata->trusted && term->cols > TRUST_SIGIL_WIDTH) {
                memmove(
                    term->wcFrom + TRUST_SIGIL_WIDTH, term->wcFrom,
                    (term->cols - TRUST_SIGIL_WIDTH) * sizeof(*term->wcFrom));
                for (it = 0; it < TRUST_SIGIL_WIDTH; it++) {
                    term->wcFrom[it].origwc = term->wcFrom[it].wc =
                        (it == 0 ? TRUST_SIGIL_CHAR :
                         it == 1 ? UCSWIDE : ' ');
                    term->wcFrom[it].index = BIDI_CHAR_INDEX_NONE;
                    term->wcFrom[it].nchars = 1;
                }
            }

            int nbc = 0;
            for (it = 0; it < term->cols; it++) {
                term->wcFrom[nbc] = term->wcFrom[it];
                if (it+1 < term->cols && term->wcFrom[it+1].wc == UCSWIDE) {
                    term->wcFrom[nbc].nchars++;
                    it++;
                }
                nbc++;
            }

            if(!term->no_bidi)
                do_bidi(term->bidi_ctx, term->wcFrom, nbc);

            if(!term->no_arabicshaping) {
                do_shape(term->wcFrom, term->wcTo, nbc);
            } else {
                /* If we're not calling do_shape, we must copy the
                 * data into wcTo anyway, unchanged */
                memcpy(term->wcTo, term->wcFrom, nbc * sizeof(*term->wcTo));
            }

            if (term->ltemp_size < ldata->size) {
                term->ltemp_size = ldata->size;
                term->ltemp = sresize(term->ltemp, term->ltemp_size,
                                      termchar);
            }

            memcpy(term->ltemp, ldata->chars, ldata->size * TSIZE);

            int opos = 0;
            for (it=0; it<nbc; it++) {
                int ipos = term->wcTo[it].index;
                for (int j = 0; j < term->wcTo[it].nchars; j++) {
                    if (ipos != BIDI_CHAR_INDEX_NONE) {
                        term->ltemp[opos] = ldata->chars[ipos];
                        if (term->ltemp[opos].cc_next)
                            term->ltemp[opos].cc_next -= opos - ipos;

                        if (j > 0)
                            term->ltemp[opos].chr = UCSWIDE;
                        else if (term->wcTo[it].origwc != term->wcTo[it].wc)
                            term->ltemp[opos].chr = term->wcTo[it].wc;
                    } else {
                        term->ltemp[opos] = term->basic_erase_char;
                        term->ltemp[opos].chr =
                            j > 0 ? UCSWIDE : term->wcTo[it].origwc;
                    }
                    opos++;
                }
            }
            assert(opos == term->cols);
            term_bidi_cache_store(term, scr_y, ldata->chars,
                                  term->ltemp, term->wcTo,
                                  term->cols, ldata->size, ldata->trusted);

            lchars = term->ltemp;
        } else {
            lchars = term->post_bidi_cache[scr_y].chars;
        }
    } else {
        lchars = NULL;
    }

    return lchars;
}